

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestEagerMessage::~TestEagerMessage(TestEagerMessage *this)

{
  ~TestEagerMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestEagerMessage::~TestEagerMessage() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestEagerMessage)
  SharedDtor(*this);
}